

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.hpp
# Opt level: O0

void __thiscall fw::Mesh<fw::StandardVertex3D>::destroyBuffers(Mesh<fw::StandardVertex3D> *this)

{
  Writer *pWVar1;
  Writer local_80;
  Mesh<fw::StandardVertex3D> *local_10;
  Mesh<fw::StandardVertex3D> *this_local;
  
  local_10 = this;
  el::base::Writer::Writer
            (&local_80,Debug,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/framework/Mesh.hpp"
             ,0x94,
             "void fw::Mesh<fw::StandardVertex3D>::destroyBuffers() [VertexType = fw::StandardVertex3D]"
             ,NormalLog,0);
  pWVar1 = el::base::Writer::construct(&local_80,1,"framework");
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [25])"Destroying buffers (vao=");
  pWVar1 = el::base::Writer::operator<<(pWVar1,&this->_vao);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [6])" vbo=");
  pWVar1 = el::base::Writer::operator<<(pWVar1,&this->_vbo);
  pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [6])" ebo=");
  pWVar1 = el::base::Writer::operator<<(pWVar1,&this->_ebo);
  el::base::Writer::operator<<(pWVar1,(char (*) [3])0x23293b);
  el::base::Writer::~Writer(&local_80);
  if (this->_vbo != 0) {
    (*glad_glDeleteBuffers)(1,&this->_vbo);
  }
  if (this->_ebo != 0) {
    (*glad_glDeleteBuffers)(1,&this->_ebo);
  }
  if (this->_vao != 0) {
    (*glad_glDeleteVertexArrays)(1,&this->_vao);
  }
  this->_ebo = 0;
  this->_vbo = 0;
  this->_vao = 0;
  return;
}

Assistant:

void Mesh<VertexType>::destroyBuffers()
{
    LOG(DEBUG) << "Destroying buffers (vao=" << _vao << " vbo=" << _vbo
        << " ebo=" << _ebo << ").";

    if (_vbo) glDeleteBuffers(1, &_vbo);
    if (_ebo) glDeleteBuffers(1, &_ebo);
    if (_vao) glDeleteVertexArrays(1, &_vao);
    _vao = _vbo = _ebo = 0;
}